

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall wallet::CWallet::UpgradeDescriptorCache(CWallet *this)

{
  long lVar1;
  bool bVar2;
  reference ppSVar3;
  CWallet *in_RDI;
  long in_FS_OFFSET;
  DescriptorScriptPubKeyMan *desc_spkm;
  ScriptPubKeyMan *spkm;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *in_stack_ffffffffffffff68;
  CWallet *in_stack_ffffffffffffff70;
  CWallet *in_stack_ffffffffffffff78;
  undefined1 *flags;
  CWallet *in_stack_ffffffffffffffb8;
  undefined1 local_38 [40];
  DescriptorScriptPubKeyMan *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsWalletFlagSet(in_stack_ffffffffffffff78,(uint64_t)in_stack_ffffffffffffff70);
  if (((bVar2) && (bVar2 = IsLocked(in_stack_ffffffffffffff70), !bVar2)) &&
     (bVar2 = IsWalletFlagSet(in_stack_ffffffffffffff78,(uint64_t)in_stack_ffffffffffffff70), !bVar2
     )) {
    GetAllScriptPubKeyMans(in_stack_ffffffffffffffb8);
    flags = local_38;
    std::
    set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
    ::begin((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
             *)in_stack_ffffffffffffff70);
    std::
    set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
    ::end((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
           *)in_stack_ffffffffffffff70);
    while (bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff78,
                                   (_Self *)in_stack_ffffffffffffff70), ((bVar2 ^ 0xffU) & 1) != 0)
    {
      ppSVar3 = std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator*
                          ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
                           in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff78 = (CWallet *)*ppSVar3;
      if (in_stack_ffffffffffffff78 == (CWallet *)0x0) {
        in_stack_ffffffffffffff70 = (CWallet *)0x0;
      }
      else {
        in_stack_ffffffffffffff70 =
             (CWallet *)
             __dynamic_cast(in_stack_ffffffffffffff78,&ScriptPubKeyMan::typeinfo,
                            &DescriptorScriptPubKeyMan::typeinfo,0);
      }
      DescriptorScriptPubKeyMan::UpgradeDescriptorCache(in_stack_fffffffffffffff0);
      std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator++
                ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)in_stack_ffffffffffffff68);
    }
    std::
    set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
    ::~set(in_stack_ffffffffffffff68);
    SetWalletFlag(in_RDI,(uint64_t)flags);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CWallet::UpgradeDescriptorCache()
{
    if (!IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS) || IsLocked() || IsWalletFlagSet(WALLET_FLAG_LAST_HARDENED_XPUB_CACHED)) {
        return;
    }

    for (ScriptPubKeyMan* spkm : GetAllScriptPubKeyMans()) {
        DescriptorScriptPubKeyMan* desc_spkm = dynamic_cast<DescriptorScriptPubKeyMan*>(spkm);
        desc_spkm->UpgradeDescriptorCache();
    }
    SetWalletFlag(WALLET_FLAG_LAST_HARDENED_XPUB_CACHED);
}